

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_int>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  bool bVar1;
  uint __val;
  char cVar2;
  char cVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  ulong uVar6;
  byte *pbVar7;
  string __str;
  string local_60;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_3c = *(uint *)(binary + region->offset);
  if (region->length != 0) {
    pbVar7 = binary + region->offset + region->length;
    uVar6 = 0;
    uVar5 = extraout_RDX;
    do {
      pbVar7 = pbVar7 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar7,(uint8_t)uVar5);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar5 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_RDX_01;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = local_3c;
  cVar3 = '\x01';
  if (9 < local_3c) {
    uVar4 = local_3c;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar4 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_003230c2;
      }
      if (uVar4 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_003230c2;
      }
      if (uVar4 < 10000) goto LAB_003230c2;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_003230c2:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_60._M_dataplus._M_p,(uint)local_60._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}